

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

data_ptr_t
duckdb::StandardBufferManager::BufferAllocatorAllocate
          (PrivateAllocatorData *private_data,idx_t size)

{
  StandardBufferManager *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> args_1;
  Allocator *this_00;
  data_ptr_t pdVar1;
  idx_t in_RCX;
  undefined1 auStack_60 [8];
  TempBufferPoolReservation reservation;
  string local_40;
  
  this = (StandardBufferManager *)private_data[1]._vptr_PrivateAllocatorData;
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_40,(StringUtil *)size,0x400,in_RCX);
  args_1._8_16_ = _auStack_60;
  args_1._M_dataplus._M_p = (pointer)&local_40;
  args_1.field_2._8_8_ = reservation.super_BufferPoolReservation.size;
  EvictBlocksOrThrow<char_const*,std::__cxx11::string>
            (&reservation,this,ALLOCATOR,size,
             (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)0x0,
             "failed to allocate data of size %s%s",args_1);
  ::std::__cxx11::string::~string((string *)&local_40);
  reservation.super_BufferPoolReservation.size = 0;
  this_00 = Allocator::Get((DatabaseInstance *)private_data[1]._vptr_PrivateAllocatorData[1]);
  pdVar1 = Allocator::AllocateData(this_00,size);
  TempBufferPoolReservation::~TempBufferPoolReservation(&reservation);
  return pdVar1;
}

Assistant:

data_ptr_t StandardBufferManager::BufferAllocatorAllocate(PrivateAllocatorData *private_data, idx_t size) {
	auto &data = private_data->Cast<BufferAllocatorData>();
	auto reservation =
	    data.manager.EvictBlocksOrThrow(MemoryTag::ALLOCATOR, size, nullptr, "failed to allocate data of size %s%s",
	                                    StringUtil::BytesToHumanReadableString(size));
	// We rely on manual tracking of this one. :(
	reservation.size = 0;
	return Allocator::Get(data.manager.db).AllocateData(size);
}